

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SerialAnalyzerResults::GenerateBubbleText
          (SerialAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  byte bVar1;
  char *pcVar2;
  char *__format;
  Frame frame;
  char number_str [128];
  char result_str [128];
  Frame local_150 [16];
  ulonglong local_140;
  byte local_12f;
  char local_128 [128];
  char local_a8 [128];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_150);
  bVar1 = local_12f;
  pcVar2 = local_128;
  AnalyzerHelpers::GetNumberString
            (local_140,display_base,
             (this->mSettings->mBitsPerTransfer - 1) +
             (uint)(this->mSettings->mSerialMode == Normal),pcVar2,0x80);
  if ((local_12f & 4) == 0) {
    if (((bVar1 & 2) == 0) && ((bVar1 & 1) == 0)) goto LAB_00106876;
    AnalyzerResults::AddResultString
              ((char *)this,"!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    snprintf(local_a8,0x80,"%s (error)");
    AnalyzerResults::AddResultString
              ((char *)this,local_a8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar2 = "%s (framing error & parity error)";
    if ((bVar1 & 2) == 0) {
      pcVar2 = "%s (framing error)";
    }
    __format = "%s (parity error)";
    if ((bVar1 & 1) != 0) {
      __format = pcVar2;
    }
  }
  else {
    AnalyzerResults::AddResultString
              ((char *)this,"A",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Addr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if ((bVar1 & 1) == 0) {
      snprintf(local_a8,0x80,"Addr: %s");
      AnalyzerResults::AddResultString
                ((char *)this,local_a8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      __format = "Address: %s";
    }
    else {
      snprintf(local_a8,0x80,"Addr: %s (framing error)");
      AnalyzerResults::AddResultString
                ((char *)this,local_a8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      __format = "Address: %s (framing error)";
    }
  }
  pcVar2 = local_a8;
  snprintf(pcVar2,0x80,__format);
LAB_00106876:
  AnalyzerResults::AddResultString
            ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(local_150);
  return;
}

Assistant:

void SerialAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                                DisplayBase display_base ) // unreferenced vars commented out to remove warnings.
{
    // we only need to pay attention to 'channel' if we're making bubbles for more than one channel (as set by
    // AddChannelBubblesWillAppearOn)
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    bool framing_error = false;
    if( ( frame.mFlags & FRAMING_ERROR_FLAG ) != 0 )
        framing_error = true;

    bool parity_error = false;
    if( ( frame.mFlags & PARITY_ERROR_FLAG ) != 0 )
        parity_error = true;

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        bits_per_transfer--;

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, bits_per_transfer, number_str, 128 );

    char result_str[ 128 ];

    // MP mode address case:
    if( ( frame.mFlags & MP_MODE_ADDRESS_FLAG ) != 0 )
    {
        AddResultString( "A" );
        AddResultString( "Addr" );

        if( framing_error == false )
        {
            snprintf( result_str, sizeof( result_str ), "Addr: %s", number_str );
            AddResultString( result_str );

            snprintf( result_str, sizeof( result_str ), "Address: %s", number_str );
            AddResultString( result_str );
        }
        else
        {
            snprintf( result_str, sizeof( result_str ), "Addr: %s (framing error)", number_str );
            AddResultString( result_str );

            snprintf( result_str, sizeof( result_str ), "Address: %s (framing error)", number_str );
            AddResultString( result_str );
        }
        return;
    }

    // normal case:
    if( ( parity_error == true ) || ( framing_error == true ) )
    {
        AddResultString( "!" );

        snprintf( result_str, sizeof( result_str ), "%s (error)", number_str );
        AddResultString( result_str );

        if( framing_error == false )
            snprintf( result_str, sizeof( result_str ), "%s (parity error)", number_str );
        else if( parity_error == false )
            snprintf( result_str, sizeof( result_str ), "%s (framing error)", number_str );
        else
            snprintf( result_str, sizeof( result_str ), "%s (framing error & parity error)", number_str );

        AddResultString( result_str );
    }
    else
    {
        AddResultString( number_str );
    }
}